

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

void Prs_ManWriteVerilogSignal(FILE *pFile,Prs_Ntk_t *p,int Sig)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  uint NameId;
  
  if (Sig < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x11a,"int Abc_Lit2Var2(int)");
  }
  NameId = (uint)Sig >> 2;
  switch(Sig & 3) {
  case 0:
    pcVar3 = Prs_ObjGetName(p,NameId);
    break;
  case 1:
    if ((int)NameId < (p->vSlices).nSize) {
      pcVar3 = Prs_ObjGetName(p,(p->vSlices).pArray[NameId]);
      if ((int)(NameId + 1) < (p->vSlices).nSize) {
        pcVar4 = Prs_ManWriteRange(p,(p->vSlices).pArray[NameId + 1],1);
        fprintf((FILE *)pFile,"%s%s",pcVar3,pcVar4);
        return;
      }
    }
    goto LAB_0034d556;
  case 2:
    pcVar3 = Abc_NamStr(p->pFuns,NameId);
    break;
  case 3:
    iVar1 = (p->vConcats).nSize;
    if ((int)NameId < iVar1) {
      piVar2 = (p->vConcats).pArray;
      Prs_CatSignals_V._0_4_ = piVar2[NameId];
      Prs_CatSignals_V._4_4_ = Prs_CatSignals_V._0_4_;
      if ((int)(NameId + 1) < iVar1) {
        Prs_CatSignals_V._8_8_ = piVar2 + (NameId + 1);
        fputc(0x7b,(FILE *)pFile);
        Prs_ManWriteVerilogArray(pFile,p,(Vec_Int_t *)Prs_CatSignals_V,0);
        fputc(0x7d,(FILE *)pFile);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
LAB_0034d556:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  fputs(pcVar3,(FILE *)pFile);
  return;
}

Assistant:

static void Prs_ManWriteVerilogSignal( FILE * pFile, Prs_Ntk_t * p, int Sig )
{
    int Value = Abc_Lit2Var2( Sig );
    Prs_ManType_t Type = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    if ( Type == CBA_PRS_NAME )
        fprintf( pFile, "%s", Prs_ObjGetName(p, Value) );
    else if ( Type == CBA_PRS_CONST )
        fprintf( pFile, "%s", Prs_NtkConst(p, Value) );
    else if ( Type == CBA_PRS_SLICE )
        fprintf( pFile, "%s%s", Prs_ObjGetName(p, Prs_SliceName(p, Value)), Prs_ManWriteRange(p, Prs_SliceRange(p, Value), 1) );
    else if ( Type == CBA_PRS_CONCAT )
        Prs_ManWriteVerilogConcat( pFile, p, Value );
    else assert( 0 );
}